

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SaveIniSettingsToDisk(char *ini_filename)

{
  char *filename;
  ImFileHandle f_00;
  long in_RDI;
  ImFileHandle f;
  char *ini_data;
  size_t ini_data_size;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffd8;
  ImU64 sz;
  ImGuiContext *out_size;
  
  out_size = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  if (in_RDI != 0) {
    sz = 0;
    filename = SaveIniSettingsToMemory((size_t *)out_size);
    f_00 = ImFileOpen(filename,in_stack_ffffffffffffffd8);
    if (f_00 != (ImFileHandle)0x0) {
      ImFileWrite(out_size,sz,(ImU64)filename,f_00);
      ImFileClose((ImFileHandle)0x323186);
    }
  }
  return;
}

Assistant:

void ImGui::SaveIniSettingsToDisk(const char* ini_filename)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    if (!ini_filename)
        return;

    size_t ini_data_size = 0;
    const char* ini_data = SaveIniSettingsToMemory(&ini_data_size);
    ImFileHandle f = ImFileOpen(ini_filename, "wt");
    if (!f)
        return;
    ImFileWrite(ini_data, sizeof(char), ini_data_size, f);
    ImFileClose(f);
}